

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O3

void Cmd_mapchecksum(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  MapData *this;
  char *pcVar4;
  size_t j;
  long lVar5;
  BYTE cksum [16];
  byte local_48 [24];
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: mapchecksum <map> ...\n");
  }
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    iVar1 = 1;
    do {
      pcVar3 = FCommandLine::operator[](argv,iVar1);
      this = P_OpenMapData(pcVar3,true);
      if (this == (MapData *)0x0) {
        pcVar3 = FCommandLine::operator[](argv,iVar1);
        Printf("Cannot load %s as a map\n",pcVar3);
      }
      else {
        MapData::GetChecksum(this,local_48);
        iVar2 = FWadCollection::GetLumpFile(&Wads,this->lumpnum);
        pcVar3 = FWadCollection::GetWadName(&Wads,iVar2);
        MapData::~MapData(this);
        operator_delete(this,0xe8);
        lVar5 = 0;
        do {
          Printf("%02X",(ulong)local_48[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        pcVar4 = FCommandLine::operator[](argv,iVar1);
        Printf(" // %s %s\n",pcVar3,pcVar4);
      }
      iVar1 = iVar1 + 1;
      iVar2 = FCommandLine::argc(argv);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

CCMD (mapchecksum)
{
	MapData *map;
	BYTE cksum[16];

	if (argv.argc() < 2)
	{
		Printf("Usage: mapchecksum <map> ...\n");
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		map = P_OpenMapData(argv[i], true);
		if (map == NULL)
		{
			Printf("Cannot load %s as a map\n", argv[i]);
		}
		else
		{
			map->GetChecksum(cksum);
			const char *wadname = Wads.GetWadName(Wads.GetLumpFile(map->lumpnum));
			delete map;
			for (size_t j = 0; j < sizeof(cksum); ++j)
			{
				Printf("%02X", cksum[j]);
			}
			Printf(" // %s %s\n", wadname, argv[i]);
		}
	}
}